

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_input_is_mouse_click_in_rect(nk_input *i,nk_buttons id,nk_rect b)

{
  float fVar1;
  
  if (i != (nk_input *)0x0) {
    fVar1 = (i->mouse).buttons[id].clicked_pos.x;
    if ((b.x <= fVar1) && (fVar1 < b.x + b.w)) {
      fVar1 = (i->mouse).buttons[id].clicked_pos.y;
      if ((b.y <= fVar1) && ((fVar1 < b.y + b.h && ((i->mouse).buttons[id].down == 0)))) {
        return (nk_bool)((i->mouse).buttons[id].clicked != 0);
      }
    }
  }
  return 0;
}

Assistant:

NK_API nk_bool
nk_input_is_mouse_click_in_rect(const struct nk_input *i, enum nk_buttons id,
struct nk_rect b)
{
const struct nk_mouse_button *btn;
if (!i) return nk_false;
btn = &i->mouse.buttons[id];
return (nk_input_has_mouse_click_down_in_rect(i, id, b, nk_false) &&
btn->clicked) ? nk_true : nk_false;
}